

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O2

bool QNetworkInformation::loadBackendByName(QStringView backend)

{
  QStringView s;
  bool bVar1;
  int iVar2;
  QNetworkInformation *pQVar3;
  storage_type_conflict *extraout_RDX;
  storage_type_conflict *in_RSI;
  QNetworkInformationPrivate *in_RDI;
  long in_FS_OFFSET;
  QStringView name;
  QArrayDataPointer<char16_t> local_40;
  QStringView local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (Data *)0x5;
  local_40.ptr = L"dummy";
  local_28.m_size = (qsizetype)in_RDI;
  local_28.m_data = in_RSI;
  bVar1 = comparesEqual(&local_28,(QStringView *)&local_40);
  if (bVar1) {
    pQVar3 = QNetworkInformationPrivate::createDummy();
    bVar1 = pQVar3 != (QNetworkInformation *)0x0;
  }
  else {
    name.m_data = extraout_RDX;
    name.m_size = (qsizetype)local_28.m_data;
    pQVar3 = QNetworkInformationPrivate::create((QNetworkInformationPrivate *)local_28.m_size,name);
    if (pQVar3 == (QNetworkInformation *)0x0) {
      bVar1 = false;
    }
    else {
      (**(code **)(**(long **)(*(long *)&pQVar3->field_0x8 + 0x78) + 0x60))(&local_40);
      s.m_data = local_28.m_data;
      s.m_size = local_28.m_size;
      iVar2 = QString::compare((QString *)&local_40,s,CaseInsensitive);
      bVar1 = iVar2 == 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkInformation::loadBackendByName(QStringView backend)
{
    if (backend == u"dummy")
        return QNetworkInformationPrivate::createDummy() != nullptr;

    auto loadedBackend = QNetworkInformationPrivate::create(backend);
    return loadedBackend && loadedBackend->backendName().compare(backend, Qt::CaseInsensitive) == 0;
}